

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

void __thiscall Tokenizer::Tokenizer(Tokenizer *this,string *p)

{
  int local_44;
  variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_40;
  string *local_18;
  string *p_local;
  Tokenizer *this_local;
  
  this->pos = 0;
  this->line_number = 1;
  this->col_number = 0;
  local_18 = p;
  p_local = (string *)this;
  std::__cxx11::string::string((string *)&this->current_line);
  std::__cxx11::string::string((string *)&this->header_block_name);
  std::__cxx11::string::string((string *)&this->program,(string *)p);
  local_44 = 0;
  std::variant<int,double,std::__cxx11::string,bool,char>::variant<int,void,void,int,void>
            ((variant<int,double,std::__cxx11::string,bool,char> *)&local_40,&local_44);
  Token::Token(&this->currentToken,Empty,(tokenValue *)&local_40);
  std::
  variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  ::~variant(&local_40);
  return;
}

Assistant:

Tokenizer::Tokenizer(string p) : program(std::move(p)), currentToken(Token(Empty, 0)), pos(0), line_number(1),
                                 col_number(0) {}